

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElectromagneticEmissionSystemData.cpp
# Opt level: O0

int __thiscall
DIS::ElectromagneticEmissionSystemData::getMarshalledSize(ElectromagneticEmissionSystemData *this)

{
  pointer pTVar1;
  int iVar2;
  int iVar3;
  pointer pTVar4;
  const_reference pvVar5;
  undefined1 local_a0 [8];
  ElectromagneticEmissionBeamData listElement;
  unsigned_long_long idx;
  int marshalSize;
  ElectromagneticEmissionSystemData *this_local;
  
  iVar2 = EmitterSystem::getMarshalledSize(&this->_emitterSystem);
  iVar3 = Vector3Float::getMarshalledSize(&this->_location);
  idx._4_4_ = iVar3 + iVar2 + 4;
  listElement._trackJamTargets.
  super__Vector_base<DIS::TrackJamData,_std::allocator<DIS::TrackJamData>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  while( true ) {
    pTVar1 = listElement._trackJamTargets.
             super__Vector_base<DIS::TrackJamData,_std::allocator<DIS::TrackJamData>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    pTVar4 = (pointer)std::
                      vector<DIS::ElectromagneticEmissionBeamData,_std::allocator<DIS::ElectromagneticEmissionBeamData>_>
                      ::size(&this->_beamDataRecords);
    if (pTVar4 <= pTVar1) break;
    pvVar5 = std::
             vector<DIS::ElectromagneticEmissionBeamData,_std::allocator<DIS::ElectromagneticEmissionBeamData>_>
             ::operator[](&this->_beamDataRecords,
                          (size_type)
                          listElement._trackJamTargets.
                          super__Vector_base<DIS::TrackJamData,_std::allocator<DIS::TrackJamData>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
    ElectromagneticEmissionBeamData::ElectromagneticEmissionBeamData
              ((ElectromagneticEmissionBeamData *)local_a0,pvVar5);
    iVar2 = ElectromagneticEmissionBeamData::getMarshalledSize
                      ((ElectromagneticEmissionBeamData *)local_a0);
    idx._4_4_ = iVar2 + idx._4_4_;
    ElectromagneticEmissionBeamData::~ElectromagneticEmissionBeamData
              ((ElectromagneticEmissionBeamData *)local_a0);
    listElement._trackJamTargets.
    super__Vector_base<DIS::TrackJamData,_std::allocator<DIS::TrackJamData>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)((long)&(listElement._trackJamTargets.
                           super__Vector_base<DIS::TrackJamData,_std::allocator<DIS::TrackJamData>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage)->_vptr_TrackJamData +
                  1);
  }
  return idx._4_4_;
}

Assistant:

int ElectromagneticEmissionSystemData::getMarshalledSize() const
{
    int marshalSize = 0;

    marshalSize += 1;  // _systemDataLength
    marshalSize += 1;  // _numberOfBeams
    marshalSize += 2;  // _eimssionsPadding2
    marshalSize += _emitterSystem.getMarshalledSize(); //_emitterSystem
    marshalSize += _location.getMarshalledSize(); //_location

    for(unsigned long long idx=0; idx < _beamDataRecords.size(); idx++)
    {
        ElectromagneticEmissionBeamData listElement = _beamDataRecords[idx];
        marshalSize += listElement.getMarshalledSize();
    }

    return marshalSize;
}